

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StochasticTask::StochasticTask
          (StochasticTask *this,KnownSystemName knownNameId,SubroutineKind subroutineKind,
          size_t inputArgs,size_t outputArgs)

{
  undefined8 in_RCX;
  undefined8 *in_RDI;
  long in_R8;
  
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,subroutineKind);
  *in_RDI = &PTR__StochasticTask_00dc9740;
  in_RDI[7] = in_RCX;
  in_RDI[8] = in_R8;
  *(bool *)(in_RDI + 6) = in_R8 != 0;
  return;
}

Assistant:

StochasticTask(KnownSystemName knownNameId, SubroutineKind subroutineKind, size_t inputArgs,
                   size_t outputArgs) :
        SystemSubroutine(knownNameId, subroutineKind), inputArgs(inputArgs),
        outputArgs(outputArgs) {
        hasOutputArgs = outputArgs > 0;
    }